

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fixSelectCb(Walker *p,Select *pSelect)

{
  undefined8 *puVar1;
  int iVar2;
  int iVar3;
  long in_RSI;
  long in_RDI;
  SrcList *pList;
  int iDb;
  sqlite3 *db;
  SrcItem *pItem;
  int i;
  DbFixer *pFix;
  Expr *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  char *in_stack_ffffffffffffffb8;
  Walker *pWalker;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar4;
  _func_int_Walker_ptr_Expr_ptr **local_30;
  int local_24;
  
  puVar1 = *(undefined8 **)(in_RDI + 0x28);
  iVar2 = sqlite3FindDbName((sqlite3 *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
                            ,in_stack_ffffffffffffffb8);
  pWalker = *(Walker **)(in_RSI + 0x28);
  if (pWalker != (Walker *)0x0) {
    local_30 = &pWalker->xExprCallback;
    for (local_24 = 0; local_24 < *(int *)&pWalker->pParse; local_24 = local_24 + 1) {
      iVar4 = iVar2;
      if ((*(char *)(puVar1 + 8) == '\0') && ((*(ushort *)((long)local_30 + 0x19) >> 2 & 1) == 0)) {
        if (((*(byte *)((long)local_30 + 0x1b) & 1) == 0) &&
           (local_30[8] != (_func_int_Walker_ptr_Expr_ptr *)0x0)) {
          iVar3 = sqlite3FindDbName((sqlite3 *)CONCAT44(iVar2,in_stack_ffffffffffffffc0),
                                    (char *)pWalker);
          if (iVar2 != iVar3) {
            sqlite3ErrorMsg((Parse *)*puVar1,"%s %T cannot reference objects in database %s",
                            puVar1[10],puVar1[0xb],local_30[8]);
            return 2;
          }
          sqlite3DbFree((sqlite3 *)CONCAT44(iVar2,in_stack_ffffffffffffffb0),
                        in_stack_ffffffffffffffa8);
          *(ushort *)((long)local_30 + 0x19) = *(ushort *)((long)local_30 + 0x19) & 0xfbff | 0x400;
          *(byte *)((long)local_30 + 0x1b) = *(byte *)((long)local_30 + 0x1b) & 0xfd | 2;
          in_stack_ffffffffffffffb4 = iVar2;
        }
        local_30[8] = (_func_int_Walker_ptr_Expr_ptr *)puVar1[7];
        *(ushort *)((long)local_30 + 0x19) = *(ushort *)((long)local_30 + 0x19) & 0xfeff | 0x100;
        *(byte *)((long)local_30 + 0x1b) = *(byte *)((long)local_30 + 0x1b) & 0xfe | 1;
      }
      if (((*(ushort *)((long)pWalker + (long)local_24 * 0x48 + 0x21) >> 0xb & 1) == 0) &&
         (iVar2 = sqlite3WalkExpr((Walker *)
                                  CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                                  in_stack_ffffffffffffffa8), iVar2 != 0)) {
        return 2;
      }
      local_30 = local_30 + 9;
      iVar2 = iVar4;
    }
    if (*(long *)(in_RSI + 0x68) != 0) {
      for (local_24 = 0; local_24 < **(int **)(in_RSI + 0x68); local_24 = local_24 + 1) {
        iVar2 = sqlite3WalkSelect(pWalker,(Select *)
                                          CONCAT44(in_stack_ffffffffffffffb4,
                                                   in_stack_ffffffffffffffb0));
        if (iVar2 != 0) {
          return 2;
        }
      }
    }
  }
  return 0;
}

Assistant:

static int fixSelectCb(Walker *p, Select *pSelect){
  DbFixer *pFix = p->u.pFix;
  int i;
  SrcItem *pItem;
  sqlite3 *db = pFix->pParse->db;
  int iDb = sqlite3FindDbName(db, pFix->zDb);
  SrcList *pList = pSelect->pSrc;

  if( NEVER(pList==0) ) return WRC_Continue;
  for(i=0, pItem=pList->a; i<pList->nSrc; i++, pItem++){
    if( pFix->bTemp==0 && pItem->fg.isSubquery==0 ){
      if( pItem->fg.fixedSchema==0 && pItem->u4.zDatabase!=0 ){
        if( iDb!=sqlite3FindDbName(db, pItem->u4.zDatabase) ){
          sqlite3ErrorMsg(pFix->pParse,
              "%s %T cannot reference objects in database %s",
              pFix->zType, pFix->pName, pItem->u4.zDatabase);
          return WRC_Abort;
        }
        sqlite3DbFree(db, pItem->u4.zDatabase);
        pItem->fg.notCte = 1;
        pItem->fg.hadSchema = 1;
      }
      pItem->u4.pSchema = pFix->pSchema;
      pItem->fg.fromDDL = 1;
      pItem->fg.fixedSchema = 1;
    }
#if !defined(SQLITE_OMIT_VIEW) || !defined(SQLITE_OMIT_TRIGGER)
    if( pList->a[i].fg.isUsing==0
     && sqlite3WalkExpr(&pFix->w, pList->a[i].u3.pOn)
    ){
      return WRC_Abort;
    }
#endif
  }
  if( pSelect->pWith ){
    for(i=0; i<pSelect->pWith->nCte; i++){
      if( sqlite3WalkSelect(p, pSelect->pWith->a[i].pSelect) ){
        return WRC_Abort;
      }
    }
  }
  return WRC_Continue;
}